

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O3

string * __thiscall
rcg::(anonymous_namespace)::cDevGetInfo_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Device *obj,
          shared_ptr<const_rcg::GenTLWrapper> *gentl,DEVICE_INFO_CMD info)

{
  Interface *pIVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  string *psVar3;
  string *psVar4;
  string *extraout_RAX;
  void *pvVar5;
  string *extraout_RAX_00;
  int iVar6;
  size_t i;
  ulong uVar7;
  INFO_DATATYPE type;
  size_t tmp_size;
  char tmp [1024];
  int local_44c;
  ulong local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_440;
  char local_438 [1032];
  
  local_440 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_440;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_44c = 0;
  memset(local_438,0,0x400);
  local_448 = 0x400;
  if (*(long *)(this + 0x80) == 0) {
    pIVar1 = *(Interface **)(this + 0x10);
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x18);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    psVar4 = (string *)Interface::getHandle(pIVar1);
    psVar3 = psVar4;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      psVar3 = extraout_RAX;
    }
    if (psVar4 == (string *)0x0) {
      return psVar3;
    }
    p_Var2 = (((obj->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
               super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->rport).
             super___shared_ptr<rcg::CPort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    pIVar1 = *(Interface **)(this + 0x10);
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x18);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    pvVar5 = Interface::getHandle(pIVar1);
    psVar3 = (string *)
             (*(code *)p_Var2)(pvVar5,*(undefined8 *)(this + 0x30),(ulong)gentl & 0xffffffff,
                               &local_44c,local_438,&local_448);
    iVar6 = (int)psVar3;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      psVar3 = extraout_RAX_00;
    }
  }
  else {
    psVar3 = (string *)
             (*(code *)(((obj->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
                         super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       eventadapter).
                       super___shared_ptr<GenApi_3_4::CEventAdapterGeneric,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)
                       (*(long *)(this + 0x80),(ulong)gentl & 0xffffffff,&local_44c,local_438,
                        &local_448);
    iVar6 = (int)psVar3;
  }
  if (((iVar6 == 0) && (local_44c == 1)) && (local_448 != 0)) {
    uVar7 = 0;
    do {
      if (local_438[uVar7] == '\0') {
        return (string *)CONCAT71((int7)((ulong)psVar3 >> 8),local_438[uVar7]);
      }
      psVar3 = (string *)std::__cxx11::string::push_back((char)__return_storage_ptr__);
      uVar7 = uVar7 + 1;
    } while (uVar7 < local_448);
  }
  return psVar3;
}

Assistant:

std::string cDevGetInfo(const Device *obj, const std::shared_ptr<const GenTLWrapper> &gentl,
                        GenTL::DEVICE_INFO_CMD info)
{
  std::string ret;

  GenTL::INFO_DATATYPE type=GenTL::INFO_DATATYPE_UNKNOWN;
  char tmp[1024]="";
  size_t tmp_size=sizeof(tmp);
  GenTL::GC_ERROR err=GenTL::GC_ERR_ERROR;

  if (obj->getHandle() != 0)
  {
    err=gentl->DevGetInfo(obj->getHandle(), info, &type, tmp, &tmp_size);
  }
  else if (obj->getParent()->getHandle() != 0)
  {
    err=gentl->IFGetDeviceInfo(obj->getParent()->getHandle(), obj->getID().c_str(), info, &type,
                               tmp, &tmp_size);
  }

  if (err == GenTL::GC_ERR_SUCCESS && type == GenTL::INFO_DATATYPE_STRING)
  {
    for (size_t i=0; i<tmp_size && tmp[i] != '\0'; i++)
    {
      ret.push_back(tmp[i]);
    }
  }

  return ret;
}